

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

void opj_pi_update_encode_not_poc
               (opj_cp_t *p_cp,OPJ_UINT32 p_num_comps,OPJ_UINT32 p_tileno,OPJ_UINT32 p_tx0,
               OPJ_UINT32 p_tx1,OPJ_UINT32 p_ty0,OPJ_UINT32 p_ty1,OPJ_UINT32 p_max_prec,
               OPJ_UINT32 p_max_res,OPJ_UINT32 p_dx_min,OPJ_UINT32 p_dy_min)

{
  OPJ_PROG_ORDER OVar1;
  OPJ_UINT32 OVar2;
  opj_tcp_t *poVar3;
  int iVar4;
  OPJ_UINT32 *pOVar5;
  
  if (p_tileno < p_cp->th * p_cp->tw) {
    poVar3 = p_cp->tcps;
    if (poVar3[p_tileno].numpocs != 0xffffffff) {
      OVar1 = poVar3[p_tileno].prg;
      OVar2 = poVar3[p_tileno].numlayers;
      iVar4 = poVar3[p_tileno].numpocs + 1;
      pOVar5 = &poVar3[p_tileno].pocs[0].dy;
      do {
        pOVar5[-7] = p_num_comps;
        pOVar5[-8] = p_max_res;
        pOVar5[-9] = OVar2;
        pOVar5[-0x15] = OVar1;
        *(undefined8 *)(pOVar5 + -0xd) = 0;
        *(undefined8 *)(pOVar5 + -0xb) = 0;
        pOVar5[-6] = p_max_prec;
        pOVar5[-5] = p_tx0;
        pOVar5[-4] = p_tx1;
        pOVar5[-3] = p_ty0;
        pOVar5[-2] = p_ty1;
        pOVar5[-1] = p_dx_min;
        *pOVar5 = p_dy_min;
        pOVar5 = pOVar5 + 0x25;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    return;
  }
  __assert_fail("p_tileno < p_cp->tw * p_cp->th",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                ,0x4a4,
                "void opj_pi_update_encode_not_poc(opj_cp_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
               );
}

Assistant:

static void opj_pi_update_encode_not_poc(opj_cp_t *p_cp,
        OPJ_UINT32 p_num_comps,
        OPJ_UINT32 p_tileno,
        OPJ_UINT32 p_tx0,
        OPJ_UINT32 p_tx1,
        OPJ_UINT32 p_ty0,
        OPJ_UINT32 p_ty1,
        OPJ_UINT32 p_max_prec,
        OPJ_UINT32 p_max_res,
        OPJ_UINT32 p_dx_min,
        OPJ_UINT32 p_dy_min)
{
    /* loop*/
    OPJ_UINT32 pino;
    /* tile coding parameter*/
    opj_tcp_t *l_tcp = 00;
    /* current poc being updated*/
    opj_poc_t * l_current_poc = 00;
    /* number of pocs*/
    OPJ_UINT32 l_poc_bound;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_tileno < p_cp->tw * p_cp->th);

    /* initializations*/
    l_tcp = &p_cp->tcps [p_tileno];

    /* number of iterations in the loop */
    l_poc_bound = l_tcp->numpocs + 1;

    /* start at first element, and to make sure the compiler will not make a calculation each time in the loop
       store a pointer to the current element to modify rather than l_tcp->pocs[i]*/
    l_current_poc = l_tcp->pocs;

    for (pino = 0; pino < l_poc_bound ; ++pino) {
        l_current_poc->compS = 0;
        l_current_poc->compE = p_num_comps;/*p_image->numcomps;*/
        l_current_poc->resS = 0;
        l_current_poc->resE = p_max_res;
        l_current_poc->layS = 0;
        l_current_poc->layE = l_tcp->numlayers;
        l_current_poc->prg  = l_tcp->prg;
        l_current_poc->prcS = 0;
        l_current_poc->prcE = p_max_prec;
        l_current_poc->txS = p_tx0;
        l_current_poc->txE = p_tx1;
        l_current_poc->tyS = p_ty0;
        l_current_poc->tyE = p_ty1;
        l_current_poc->dx = p_dx_min;
        l_current_poc->dy = p_dy_min;
        ++ l_current_poc;
    }
}